

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O0

int StartCDAudioPlaying(SDL12_CD *cdrom,int start_track,int start_frame,int ntracks,int nframes)

{
  drmp3 *mp3_00;
  SDL12_CDstatus SVar1;
  int local_4c;
  uint local_48;
  SDL_bool local_40;
  drmp3_uint32 pcm_frame;
  SDL_bool seeking;
  SDL_bool loaded;
  drmp3 *mp3;
  int nframes_local;
  int ntracks_local;
  int start_frame_local;
  int start_track_local;
  SDL12_CD *cdrom_local;
  
  mp3_00 = (drmp3 *)(*SDL20_malloc)(0x3ec0);
  if (mp3_00 == (drmp3 *)0x0) {
    local_40 = SDL_FALSE;
  }
  else {
    local_40 = LoadCDTrack(start_track,mp3_00);
  }
  if (local_40 != SDL_FALSE && 0 < start_frame) {
    local_48 = (uint)(long)(((double)start_frame / 75.0) * (double)(int)mp3_00->sampleRate);
  }
  else {
    local_48 = 0;
  }
  if (mp3_00 == (drmp3 *)0x0) {
    cdrom_local._4_4_ = (*SDL20_Error)(SDL_ENOMEM);
  }
  else {
    if (local_40 != SDL_FALSE && 0 < start_frame) {
      drmp3_seek_to_pcm_frame(mp3_00,(ulong)local_48);
    }
    (*SDL20_LockAudio)();
    if (audio_cbdata != (AudioCallbackWrapperData *)0x0) {
      SVar1 = SDL12_CD_TRAYEMPTY;
      if (local_40 != SDL_FALSE) {
        SVar1 = SDL12_CD_PLAYING;
      }
      audio_cbdata->cdrom_status = SVar1;
      cdrom->status = SVar1;
      audio_cbdata->cdrom_pcm_frames_written = local_48;
      audio_cbdata->cdrom_cur_track = start_track;
      audio_cbdata->cdrom_cur_frame = start_frame;
      audio_cbdata->cdrom_stop_ntracks = ntracks;
      audio_cbdata->cdrom_stop_nframes = nframes;
      FreeMp3(&audio_cbdata->cdrom_mp3);
      if (local_40 != SDL_FALSE) {
        (*SDL20_memcpy)(&audio_cbdata->cdrom_mp3,mp3_00,0x3ec0);
      }
    }
    (*SDL20_UnlockAudio)();
    (*SDL20_free)(mp3_00);
    if (local_40 == SDL_FALSE) {
      local_4c = (*SDL20_SetError)("Failed to start CD track");
    }
    else {
      local_4c = 0;
    }
    cdrom_local._4_4_ = local_4c;
  }
  return cdrom_local._4_4_;
}

Assistant:

static int
StartCDAudioPlaying(SDL12_CD *cdrom, const int start_track, const int start_frame, const int ntracks, const int nframes)
{
    drmp3 *mp3 = (drmp3 *) SDL20_malloc(sizeof (drmp3));
    const SDL_bool loaded = mp3 ? LoadCDTrack(start_track, mp3) : SDL_FALSE;
    const SDL_bool seeking = (loaded && (start_frame > 0))? SDL_TRUE : SDL_FALSE;
    const drmp3_uint32 pcm_frame = seeking ? (Uint32) ((start_frame / 75.0) * (Sint32)mp3->sampleRate) : 0;

    if (!mp3) {
        return SDL20_OutOfMemory();
    }

    if (seeking) {   /* do seeking before handing off to the audio thread. */
        drmp3_seek_to_pcm_frame(mp3, pcm_frame);
    }

    SDL20_LockAudio();
    if (audio_cbdata) {
        cdrom->status = audio_cbdata->cdrom_status = loaded ? SDL12_CD_PLAYING : SDL12_CD_TRAYEMPTY;
        audio_cbdata->cdrom_pcm_frames_written = (int) pcm_frame;
        audio_cbdata->cdrom_cur_track = start_track;
        audio_cbdata->cdrom_cur_frame = start_frame;
        audio_cbdata->cdrom_stop_ntracks = ntracks;
        audio_cbdata->cdrom_stop_nframes = nframes;
        FreeMp3(&audio_cbdata->cdrom_mp3);
        if (loaded) {
            SDL20_memcpy(&audio_cbdata->cdrom_mp3, mp3, sizeof (drmp3));
        }
    }
    SDL20_UnlockAudio();

    SDL20_free(mp3);

    return loaded ? 0 : SDL20_SetError("Failed to start CD track");
}